

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

void despot::logging::stream(int level,ostream *out)

{
  log_ostream *this;
  ulong uVar1;
  string local_40;
  
  if (level - 1U < 5) {
    this = (log_ostream *)operator_new(0x1a0);
    uVar1 = (ulong)(uint)level;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,(&markers__abi_cxx11_)[uVar1 * 4],
               (&DAT_00193538)[uVar1 * 4] + (&markers__abi_cxx11_)[uVar1 * 4]);
    log_ostream::log_ostream(this,out,&local_40);
    *(log_ostream **)(streams_ + uVar1 * 8) = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void logging::stream(int level, ostream& out) {
	if (level >= ERROR && level <= VERBOSE) {
		streams_[level] = new log_ostream(out, markers_[level]);
	}
}